

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timDump.c
# Opt level: O1

Vec_Str_t * Tim_ManSave(Tim_Man_t *p,int fHieOnly)

{
  float fVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  float *pfVar5;
  Tim_Obj_t *pTVar6;
  Vec_Str_t *vOut;
  char *pcVar7;
  Vec_Ptr_t *pVVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  size_t sVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  float fVar16;
  
  vOut = (Vec_Str_t *)malloc(0x10);
  vOut->nCap = 10000;
  vOut->nSize = 0;
  pcVar7 = (char *)malloc(10000);
  vOut->pArray = pcVar7;
  iVar13 = 0x18;
  do {
    uVar2 = vOut->nCap;
    if (vOut->nSize == uVar2) {
      if ((int)uVar2 < 0x10) {
        if (vOut->pArray == (char *)0x0) {
          pcVar7 = (char *)malloc(0x10);
        }
        else {
          pcVar7 = (char *)realloc(vOut->pArray,0x10);
        }
        sVar12 = 0x10;
      }
      else {
        sVar12 = (ulong)uVar2 * 2;
        if ((int)sVar12 <= (int)uVar2) goto LAB_00419ae8;
        if (vOut->pArray == (char *)0x0) {
          pcVar7 = (char *)malloc(sVar12);
        }
        else {
          pcVar7 = (char *)realloc(vOut->pArray,sVar12);
        }
      }
      vOut->pArray = pcVar7;
      vOut->nCap = (int)sVar12;
    }
LAB_00419ae8:
    iVar11 = vOut->nSize;
    vOut->nSize = iVar11 + 1;
    vOut->pArray[iVar11] = (char)(1 >> ((byte)iVar13 & 0x1f));
    iVar13 = iVar13 + -8;
  } while (iVar13 != -8);
  iVar13 = Tim_ManCiNum(p);
  iVar11 = 0x18;
  do {
    uVar2 = vOut->nCap;
    if (vOut->nSize == uVar2) {
      if ((int)uVar2 < 0x10) {
        if (vOut->pArray == (char *)0x0) {
          pcVar7 = (char *)malloc(0x10);
        }
        else {
          pcVar7 = (char *)realloc(vOut->pArray,0x10);
        }
        sVar12 = 0x10;
      }
      else {
        sVar12 = (ulong)uVar2 * 2;
        if ((int)sVar12 <= (int)uVar2) goto LAB_00419b86;
        if (vOut->pArray == (char *)0x0) {
          pcVar7 = (char *)malloc(sVar12);
        }
        else {
          pcVar7 = (char *)realloc(vOut->pArray,sVar12);
        }
      }
      vOut->pArray = pcVar7;
      vOut->nCap = (int)sVar12;
    }
LAB_00419b86:
    iVar3 = vOut->nSize;
    vOut->nSize = iVar3 + 1;
    vOut->pArray[iVar3] = (char)(iVar13 >> ((byte)iVar11 & 0x1f));
    iVar11 = iVar11 + -8;
  } while (iVar11 != -8);
  iVar13 = Tim_ManCoNum(p);
  iVar11 = 0x18;
  do {
    uVar2 = vOut->nCap;
    if (vOut->nSize == uVar2) {
      if ((int)uVar2 < 0x10) {
        if (vOut->pArray == (char *)0x0) {
          pcVar7 = (char *)malloc(0x10);
        }
        else {
          pcVar7 = (char *)realloc(vOut->pArray,0x10);
        }
        sVar12 = 0x10;
      }
      else {
        sVar12 = (ulong)uVar2 * 2;
        if ((int)sVar12 <= (int)uVar2) goto LAB_00419c21;
        if (vOut->pArray == (char *)0x0) {
          pcVar7 = (char *)malloc(sVar12);
        }
        else {
          pcVar7 = (char *)realloc(vOut->pArray,sVar12);
        }
      }
      vOut->pArray = pcVar7;
      vOut->nCap = (int)sVar12;
    }
LAB_00419c21:
    iVar3 = vOut->nSize;
    vOut->nSize = iVar3 + 1;
    vOut->pArray[iVar3] = (char)(iVar13 >> ((byte)iVar11 & 0x1f));
    iVar11 = iVar11 + -8;
  } while (iVar11 != -8);
  iVar13 = Tim_ManPiNum(p);
  iVar11 = 0x18;
  do {
    uVar2 = vOut->nCap;
    if (vOut->nSize == uVar2) {
      if ((int)uVar2 < 0x10) {
        if (vOut->pArray == (char *)0x0) {
          pcVar7 = (char *)malloc(0x10);
        }
        else {
          pcVar7 = (char *)realloc(vOut->pArray,0x10);
        }
        sVar12 = 0x10;
      }
      else {
        sVar12 = (ulong)uVar2 * 2;
        if ((int)sVar12 <= (int)uVar2) goto LAB_00419cbc;
        if (vOut->pArray == (char *)0x0) {
          pcVar7 = (char *)malloc(sVar12);
        }
        else {
          pcVar7 = (char *)realloc(vOut->pArray,sVar12);
        }
      }
      vOut->pArray = pcVar7;
      vOut->nCap = (int)sVar12;
    }
LAB_00419cbc:
    iVar3 = vOut->nSize;
    vOut->nSize = iVar3 + 1;
    vOut->pArray[iVar3] = (char)(iVar13 >> ((byte)iVar11 & 0x1f));
    iVar11 = iVar11 + -8;
  } while (iVar11 != -8);
  iVar13 = Tim_ManPoNum(p);
  iVar11 = 0x18;
  do {
    uVar2 = vOut->nCap;
    if (vOut->nSize == uVar2) {
      if ((int)uVar2 < 0x10) {
        if (vOut->pArray == (char *)0x0) {
          pcVar7 = (char *)malloc(0x10);
        }
        else {
          pcVar7 = (char *)realloc(vOut->pArray,0x10);
        }
        sVar12 = 0x10;
      }
      else {
        sVar12 = (ulong)uVar2 * 2;
        if ((int)sVar12 <= (int)uVar2) goto LAB_00419d57;
        if (vOut->pArray == (char *)0x0) {
          pcVar7 = (char *)malloc(sVar12);
        }
        else {
          pcVar7 = (char *)realloc(vOut->pArray,sVar12);
        }
      }
      vOut->pArray = pcVar7;
      vOut->nCap = (int)sVar12;
    }
LAB_00419d57:
    iVar3 = vOut->nSize;
    vOut->nSize = iVar3 + 1;
    vOut->pArray[iVar3] = (char)(iVar13 >> ((byte)iVar11 & 0x1f));
    iVar11 = iVar11 + -8;
  } while (iVar11 != -8);
  iVar13 = Tim_ManBoxNum(p);
  iVar11 = 0x18;
  do {
    uVar2 = vOut->nCap;
    if (vOut->nSize == uVar2) {
      if ((int)uVar2 < 0x10) {
        if (vOut->pArray == (char *)0x0) {
          pcVar7 = (char *)malloc(0x10);
        }
        else {
          pcVar7 = (char *)realloc(vOut->pArray,0x10);
        }
        sVar12 = 0x10;
      }
      else {
        sVar12 = (ulong)uVar2 * 2;
        if ((int)sVar12 <= (int)uVar2) goto LAB_00419df2;
        if (vOut->pArray == (char *)0x0) {
          pcVar7 = (char *)malloc(sVar12);
        }
        else {
          pcVar7 = (char *)realloc(vOut->pArray,sVar12);
        }
      }
      vOut->pArray = pcVar7;
      vOut->nCap = (int)sVar12;
    }
LAB_00419df2:
    iVar3 = vOut->nSize;
    vOut->nSize = iVar3 + 1;
    vOut->pArray[iVar3] = (char)(iVar13 >> ((byte)iVar11 & 0x1f));
    iVar11 = iVar11 + -8;
  } while (iVar11 != -8);
  iVar13 = Tim_ManBoxNum(p);
  if ((0 < iVar13) && (pVVar8 = p->vBoxes, 0 < pVVar8->nSize)) {
    lVar10 = 0;
    do {
      piVar4 = (int *)pVVar8->pArray[lVar10];
      iVar13 = Tim_ManBoxInputNum(p,*piVar4);
      iVar11 = 0x18;
      do {
        uVar2 = vOut->nCap;
        if (vOut->nSize == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (vOut->pArray == (char *)0x0) {
              pcVar7 = (char *)malloc(0x10);
            }
            else {
              pcVar7 = (char *)realloc(vOut->pArray,0x10);
            }
            sVar12 = 0x10;
          }
          else {
            sVar12 = (ulong)uVar2 * 2;
            if ((int)sVar12 <= (int)uVar2) goto LAB_00419ebf;
            if (vOut->pArray == (char *)0x0) {
              pcVar7 = (char *)malloc(sVar12);
            }
            else {
              pcVar7 = (char *)realloc(vOut->pArray,sVar12);
            }
          }
          vOut->pArray = pcVar7;
          vOut->nCap = (int)sVar12;
        }
LAB_00419ebf:
        iVar3 = vOut->nSize;
        vOut->nSize = iVar3 + 1;
        vOut->pArray[iVar3] = (char)(iVar13 >> ((byte)iVar11 & 0x1f));
        iVar11 = iVar11 + -8;
      } while (iVar11 != -8);
      iVar13 = Tim_ManBoxOutputNum(p,*piVar4);
      iVar11 = 0x18;
      do {
        uVar2 = vOut->nCap;
        if (vOut->nSize == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (vOut->pArray == (char *)0x0) {
              pcVar7 = (char *)malloc(0x10);
            }
            else {
              pcVar7 = (char *)realloc(vOut->pArray,0x10);
            }
            sVar12 = 0x10;
          }
          else {
            sVar12 = (ulong)uVar2 * 2;
            if ((int)sVar12 <= (int)uVar2) goto LAB_00419f62;
            if (vOut->pArray == (char *)0x0) {
              pcVar7 = (char *)malloc(sVar12);
            }
            else {
              pcVar7 = (char *)realloc(vOut->pArray,sVar12);
            }
          }
          vOut->pArray = pcVar7;
          vOut->nCap = (int)sVar12;
        }
LAB_00419f62:
        iVar3 = vOut->nSize;
        vOut->nSize = iVar3 + 1;
        vOut->pArray[iVar3] = (char)(iVar13 >> ((byte)iVar11 & 0x1f));
        iVar11 = iVar11 + -8;
      } while (iVar11 != -8);
      iVar13 = Tim_ManBoxDelayTableId(p,*piVar4);
      iVar11 = 0x18;
      do {
        uVar2 = vOut->nCap;
        if (vOut->nSize == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (vOut->pArray == (char *)0x0) {
              pcVar7 = (char *)malloc(0x10);
            }
            else {
              pcVar7 = (char *)realloc(vOut->pArray,0x10);
            }
            sVar12 = 0x10;
          }
          else {
            sVar12 = (ulong)uVar2 * 2;
            if ((int)sVar12 <= (int)uVar2) goto LAB_0041a004;
            if (vOut->pArray == (char *)0x0) {
              pcVar7 = (char *)malloc(sVar12);
            }
            else {
              pcVar7 = (char *)realloc(vOut->pArray,sVar12);
            }
          }
          vOut->pArray = pcVar7;
          vOut->nCap = (int)sVar12;
        }
LAB_0041a004:
        iVar3 = vOut->nSize;
        vOut->nSize = iVar3 + 1;
        vOut->pArray[iVar3] = (char)(iVar13 >> ((byte)iVar11 & 0x1f));
        iVar11 = iVar11 + -8;
      } while (iVar11 != -8);
      iVar13 = Tim_ManBoxCopy(p,*piVar4);
      iVar11 = 0x18;
      do {
        uVar2 = vOut->nCap;
        if (vOut->nSize == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (vOut->pArray == (char *)0x0) {
              pcVar7 = (char *)malloc(0x10);
            }
            else {
              pcVar7 = (char *)realloc(vOut->pArray,0x10);
            }
            sVar12 = 0x10;
          }
          else {
            sVar12 = (ulong)uVar2 * 2;
            if ((int)sVar12 <= (int)uVar2) goto LAB_0041a0a6;
            if (vOut->pArray == (char *)0x0) {
              pcVar7 = (char *)malloc(sVar12);
            }
            else {
              pcVar7 = (char *)realloc(vOut->pArray,sVar12);
            }
          }
          vOut->pArray = pcVar7;
          vOut->nCap = (int)sVar12;
        }
LAB_0041a0a6:
        iVar3 = vOut->nSize;
        vOut->nSize = iVar3 + 1;
        vOut->pArray[iVar3] = (char)(iVar13 >> ((byte)iVar11 & 0x1f));
        iVar11 = iVar11 + -8;
      } while (iVar11 != -8);
      lVar10 = lVar10 + 1;
      pVVar8 = p->vBoxes;
    } while (lVar10 < pVVar8->nSize);
  }
  if (fHieOnly == 0) {
    iVar13 = Tim_ManDelayTableNum(p);
    iVar11 = 0x18;
    do {
      uVar2 = vOut->nCap;
      if (vOut->nSize == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (vOut->pArray == (char *)0x0) {
            pcVar7 = (char *)malloc(0x10);
          }
          else {
            pcVar7 = (char *)realloc(vOut->pArray,0x10);
          }
          sVar12 = 0x10;
        }
        else {
          sVar12 = (ulong)uVar2 * 2;
          if ((int)sVar12 <= (int)uVar2) goto LAB_0041a16f;
          if (vOut->pArray == (char *)0x0) {
            pcVar7 = (char *)malloc(sVar12);
          }
          else {
            pcVar7 = (char *)realloc(vOut->pArray,sVar12);
          }
        }
        vOut->pArray = pcVar7;
        vOut->nCap = (int)sVar12;
      }
LAB_0041a16f:
      iVar3 = vOut->nSize;
      vOut->nSize = iVar3 + 1;
      vOut->pArray[iVar3] = (char)(iVar13 >> ((byte)iVar11 & 0x1f));
      iVar11 = iVar11 + -8;
    } while (iVar11 != -8);
    iVar13 = Tim_ManDelayTableNum(p);
    if ((0 < iVar13) && (pVVar8 = p->vDelayTables, 0 < pVVar8->nSize)) {
      uVar9 = 0;
      do {
        pfVar5 = (float *)pVVar8->pArray[uVar9];
        fVar16 = *pfVar5;
        if (uVar9 != (uint)(int)fVar16) {
          __assert_fail("(int)pDelayTable[0] == i",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/tim/timDump.c"
                        ,0x53,"Vec_Str_t *Tim_ManSave(Tim_Man_t *, int)");
        }
        iVar13 = 0x18;
        do {
          uVar2 = vOut->nCap;
          if (vOut->nSize == uVar2) {
            if ((int)uVar2 < 0x10) {
              if (vOut->pArray == (char *)0x0) {
                pcVar7 = (char *)malloc(0x10);
              }
              else {
                pcVar7 = (char *)realloc(vOut->pArray,0x10);
              }
              sVar12 = 0x10;
            }
            else {
              sVar12 = (ulong)uVar2 * 2;
              if ((int)sVar12 <= (int)uVar2) goto LAB_0041a239;
              if (vOut->pArray == (char *)0x0) {
                pcVar7 = (char *)malloc(sVar12);
              }
              else {
                pcVar7 = (char *)realloc(vOut->pArray,sVar12);
              }
            }
            vOut->pArray = pcVar7;
            vOut->nCap = (int)sVar12;
          }
LAB_0041a239:
          iVar11 = vOut->nSize;
          vOut->nSize = iVar11 + 1;
          vOut->pArray[iVar11] = (char)((int)fVar16 >> ((byte)iVar13 & 0x1f));
          iVar13 = iVar13 + -8;
        } while (iVar13 != -8);
        fVar16 = pfVar5[1];
        iVar13 = 0x18;
        do {
          uVar2 = vOut->nCap;
          if (vOut->nSize == uVar2) {
            if ((int)uVar2 < 0x10) {
              if (vOut->pArray == (char *)0x0) {
                pcVar7 = (char *)malloc(0x10);
              }
              else {
                pcVar7 = (char *)realloc(vOut->pArray,0x10);
              }
              sVar12 = 0x10;
            }
            else {
              sVar12 = (ulong)uVar2 * 2;
              if ((int)sVar12 <= (int)uVar2) goto LAB_0041a2cc;
              if (vOut->pArray == (char *)0x0) {
                pcVar7 = (char *)malloc(sVar12);
              }
              else {
                pcVar7 = (char *)realloc(vOut->pArray,sVar12);
              }
            }
            vOut->pArray = pcVar7;
            vOut->nCap = (int)sVar12;
          }
LAB_0041a2cc:
          iVar11 = vOut->nSize;
          vOut->nSize = iVar11 + 1;
          vOut->pArray[iVar11] = (char)((int)fVar16 >> ((byte)iVar13 & 0x1f));
          iVar13 = iVar13 + -8;
        } while (iVar13 != -8);
        fVar16 = pfVar5[2];
        iVar13 = 0x18;
        do {
          uVar2 = vOut->nCap;
          if (vOut->nSize == uVar2) {
            if ((int)uVar2 < 0x10) {
              if (vOut->pArray == (char *)0x0) {
                pcVar7 = (char *)malloc(0x10);
              }
              else {
                pcVar7 = (char *)realloc(vOut->pArray,0x10);
              }
              sVar12 = 0x10;
            }
            else {
              sVar12 = (ulong)uVar2 * 2;
              if ((int)sVar12 <= (int)uVar2) goto LAB_0041a35f;
              if (vOut->pArray == (char *)0x0) {
                pcVar7 = (char *)malloc(sVar12);
              }
              else {
                pcVar7 = (char *)realloc(vOut->pArray,sVar12);
              }
            }
            vOut->pArray = pcVar7;
            vOut->nCap = (int)sVar12;
          }
LAB_0041a35f:
          iVar11 = vOut->nSize;
          vOut->nSize = iVar11 + 1;
          vOut->pArray[iVar11] = (char)((int)fVar16 >> ((byte)iVar13 & 0x1f));
          iVar13 = iVar13 + -8;
        } while (iVar13 != -8);
        fVar16 = pfVar5[1];
        fVar1 = pfVar5[2];
        if (0 < (int)fVar1 * (int)fVar16) {
          uVar14 = 0;
          do {
            Vec_StrPutF(vOut,pfVar5[uVar14 + 3]);
            uVar14 = uVar14 + 1;
          } while ((uint)((int)fVar1 * (int)fVar16) != uVar14);
        }
        uVar9 = uVar9 + 1;
        pVVar8 = p->vDelayTables;
      } while ((long)uVar9 < (long)pVVar8->nSize);
    }
    if (0 < p->nCis) {
      lVar10 = 8;
      lVar15 = 0;
      do {
        pTVar6 = p->pCis;
        if (pTVar6 == (Tim_Obj_t *)0x0) break;
        if (*(int *)((long)&pTVar6->Id + lVar10) < 0) {
          fVar16 = Tim_ManGetCiArrival(p,*(int *)((long)pTVar6 + lVar10 + -8));
          Vec_StrPutF(vOut,fVar16);
        }
        lVar15 = lVar15 + 1;
        lVar10 = lVar10 + 0x18;
      } while (lVar15 < p->nCis);
    }
    if (0 < p->nCos) {
      lVar10 = 8;
      lVar15 = 0;
      do {
        pTVar6 = p->pCos;
        if (pTVar6 == (Tim_Obj_t *)0x0) {
          return vOut;
        }
        if (*(int *)((long)&pTVar6->Id + lVar10) < 0) {
          fVar16 = Tim_ManGetCoRequired(p,*(int *)((long)pTVar6 + lVar10 + -8));
          Vec_StrPutF(vOut,fVar16);
        }
        lVar15 = lVar15 + 1;
        lVar10 = lVar10 + 0x18;
      } while (lVar15 < p->nCos);
    }
  }
  return vOut;
}

Assistant:

Vec_Str_t * Tim_ManSave( Tim_Man_t * p, int fHieOnly )
{
    Tim_Box_t * pBox;
    Tim_Obj_t * pObj;
    Vec_Str_t * vStr;
    float * pDelayTable;
    int i, k, TableSize;
    // create output stream
    vStr = Vec_StrAlloc( 10000 );
    // dump version number
    Vec_StrPutI_ne( vStr, TIM_DUMP_VER_NUM );
    // save CI/CO counts
    Vec_StrPutI_ne( vStr, Tim_ManCiNum(p) );
    Vec_StrPutI_ne( vStr, Tim_ManCoNum(p) );
    // save PI/PO counts
    Vec_StrPutI_ne( vStr, Tim_ManPiNum(p) );
    Vec_StrPutI_ne( vStr, Tim_ManPoNum(p) );
    // save number of boxes
    Vec_StrPutI_ne( vStr, Tim_ManBoxNum(p) );
    // for each box, save num_inputs, num_outputs, delay table ID, and copy field
    if ( Tim_ManBoxNum(p) > 0 )
    Tim_ManForEachBox( p, pBox, i )
    {
        Vec_StrPutI_ne( vStr, Tim_ManBoxInputNum(p, pBox->iBox) );
        Vec_StrPutI_ne( vStr, Tim_ManBoxOutputNum(p, pBox->iBox) );
        Vec_StrPutI_ne( vStr, Tim_ManBoxDelayTableId(p, pBox->iBox) ); // can be -1 if delay table is not given
        Vec_StrPutI_ne( vStr, Tim_ManBoxCopy(p, pBox->iBox) );         // can be -1 if the copy is node defined
        //Vec_StrPutI_ne( vStr, Tim_ManBoxIsBlack(p, pBox->iBox) );
    }
    if ( fHieOnly )
        return vStr;
    // save the number of delay tables
    Vec_StrPutI_ne( vStr, Tim_ManDelayTableNum(p) );
    // save the delay tables
    if ( Tim_ManDelayTableNum(p) > 0 )
    Tim_ManForEachTable( p, pDelayTable, i )
    {
        assert( (int)pDelayTable[0] == i );
        // save table ID and dimensions (inputs x outputs)
        Vec_StrPutI_ne( vStr, (int)pDelayTable[0] );
        Vec_StrPutI_ne( vStr, (int)pDelayTable[1] );
        Vec_StrPutI_ne( vStr, (int)pDelayTable[2] );
        // save table contents
        TableSize = (int)pDelayTable[1] * (int)pDelayTable[2];
        for ( k = 0; k < TableSize; k++ )
            Vec_StrPutF( vStr, pDelayTable[k+3] );
    }
    // save PI arrival times
    Tim_ManForEachPi( p, pObj, i )
        Vec_StrPutF( vStr, Tim_ManGetCiArrival(p, pObj->Id) );
    // save PO required times
    Tim_ManForEachPo( p, pObj, i )
        Vec_StrPutF( vStr, Tim_ManGetCoRequired(p, pObj->Id) );
    return vStr;
}